

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

MYSQL_ROW one_query_row(char *query)

{
  MYSQL_RES *pMVar1;
  MYSQL_ROW ppcVar2;
  
  pMVar1 = one_query_res(query);
  ppcVar2 = (MYSQL_ROW)mysql_fetch_row(pMVar1);
  mysql_free_result(pMVar1);
  return ppcVar2;
}

Assistant:

MYSQL_ROW one_query_row(char *query)
{
	MYSQL_RES *res_set;
	MYSQL_ROW row;

	res_set = one_query_res(query);
	row = mysql_fetch_row(res_set);
	mysql_free_result(res_set);
	return row;
}